

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Identifier __thiscall soul::heart::Parser::parseBlockName(Parser *this)

{
  pointer pcVar1;
  Identifier IVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view newString;
  string name;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  CompileMessage local_48;
  
  pcVar1 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).currentStringValue._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).currentStringValue._M_string_length);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x259db5);
  if (local_60 < 2) {
    CompileMessageHelpers::createMessage<std::__cxx11::string&>
              (&local_48,(CompileMessageHelpers *)0x1,none,0x27f4ab,(char *)&local_68,in_R9);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_48);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.description._M_dataplus._M_p != &local_48.description.field_2) {
      operator_delete(local_48.description._M_dataplus._M_p,
                      local_48.description.field_2._M_allocated_capacity + 1);
    }
  }
  newString._M_str = (char *)local_68;
  newString._M_len = local_60;
  IVar2 = Identifier::Pool::get(&(((this->program).pimpl)->allocator).identifiers,newString);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return (Identifier)IVar2.name;
}

Assistant:

Identifier parseBlockName()
    {
        auto name = currentStringValue;
        expect (Token::blockIdentifier);

        if (name.length() < 2)
            throwError (Errors::invalidBlockName (name));

        return program.getAllocator().get (name);
    }